

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_num_files.c
# Opt level: O2

int zip_get_num_files(zip_t *za)

{
  int iVar1;
  
  iVar1 = -1;
  if (za != (zip_t *)0x0) {
    if ((za->nentry & 0xffffffff80000000) == 0) {
      iVar1 = (int)za->nentry;
    }
    else {
      zip_error_set(&za->error,0x1c,0);
    }
  }
  return iVar1;
}

Assistant:

ZIP_EXTERN int
zip_get_num_files(zip_t *za) {
    if (za == NULL)
        return -1;

    if (za->nentry > INT_MAX) {
        zip_error_set(&za->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }

    return (int)za->nentry;
}